

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O0

sljit_s32 emit_mul(sljit_compiler *compiler,sljit_s32 dst,sljit_sw dstw,sljit_s32 src1,
                  sljit_sw src1w,sljit_s32 src2,sljit_sw src2w)

{
  sljit_s32 sVar1;
  sljit_u8 *psVar2;
  undefined1 *puVar3;
  uint local_50;
  uint local_4c;
  sljit_s32 dst_r;
  sljit_u8 *inst;
  sljit_s32 src2_local;
  sljit_sw src1w_local;
  sljit_s32 src1_local;
  sljit_sw dstw_local;
  sljit_s32 dst_local;
  sljit_compiler *compiler_local;
  
  if ((dst < 1) || (local_50 = dst, 0x3f < dst)) {
    local_50 = 0xf;
  }
  local_4c = local_50;
  if ((local_50 == src1) && ((src2 & 0x40U) == 0)) {
    psVar2 = emit_x86_instruction(compiler,2,local_50,0,src2,src2w);
    if (psVar2 == (sljit_u8 *)0x0) {
      return compiler->error;
    }
    *psVar2 = '\x0f';
    psVar2[1] = 0xaf;
  }
  else if ((local_50 == src2) && ((src1 & 0x40U) == 0)) {
    psVar2 = emit_x86_instruction(compiler,2,local_50,0,src1,src1w);
    if (psVar2 == (sljit_u8 *)0x0) {
      return compiler->error;
    }
    *psVar2 = '\x0f';
    psVar2[1] = 0xaf;
  }
  else if ((src1 & 0x40U) == 0) {
    if ((src2 & 0x40U) == 0) {
      if (((src2 & 0x80U) != 0) &&
         (((src2 & 0x3fU) == local_50 || ((src2 >> 8 & 0x3fU) == local_50)))) {
        local_4c = 0xf;
      }
      sVar1 = emit_mov(compiler,local_4c,0,src1,src1w);
      if (sVar1 != 0) {
        return compiler->error;
      }
      psVar2 = emit_x86_instruction(compiler,2,local_4c,0,src2,src2w);
      if (psVar2 == (sljit_u8 *)0x0) {
        return compiler->error;
      }
      *psVar2 = '\x0f';
      psVar2[1] = 0xaf;
    }
    else if ((src2w < 0x80) && (-0x81 < src2w)) {
      psVar2 = emit_x86_instruction(compiler,1,local_50,0,src1,src1w);
      if (psVar2 == (sljit_u8 *)0x0) {
        return compiler->error;
      }
      *psVar2 = 'k';
      puVar3 = (undefined1 *)ensure_buf(compiler,2);
      if (puVar3 == (undefined1 *)0x0) {
        return compiler->error;
      }
      *puVar3 = 1;
      compiler->size = compiler->size + 1;
      puVar3[1] = (char)src2w;
    }
    else if ((src2w < 0x80000000) && (-0x80000001 < src2w)) {
      psVar2 = emit_x86_instruction(compiler,1,local_50,0,src1,src1w);
      if (psVar2 == (sljit_u8 *)0x0) {
        return compiler->error;
      }
      *psVar2 = 'i';
      puVar3 = (undefined1 *)ensure_buf(compiler,5);
      if (puVar3 == (undefined1 *)0x0) {
        return compiler->error;
      }
      *puVar3 = 4;
      compiler->size = compiler->size + 4;
      sljit_unaligned_store_s32(puVar3 + 1,(sljit_s32)src2w);
    }
    else {
      if ((local_50 != src1) && (sVar1 = emit_mov(compiler,local_50,0,src1,src1w), sVar1 != 0)) {
        return compiler->error;
      }
      sVar1 = emit_load_imm64(compiler,0x10,src2w);
      if (sVar1 != 0) {
        return compiler->error;
      }
      psVar2 = emit_x86_instruction(compiler,2,local_50,0,0x10,0);
      if (psVar2 == (sljit_u8 *)0x0) {
        return compiler->error;
      }
      *psVar2 = '\x0f';
      psVar2[1] = 0xaf;
    }
  }
  else {
    inst._4_4_ = src2;
    if ((src2 & 0x40U) != 0) {
      sVar1 = emit_mov(compiler,local_50,0,0x40,src2w);
      if (sVar1 != 0) {
        return compiler->error;
      }
      inst._4_4_ = local_50;
      src2w = 0;
    }
    if ((src1w < 0x80) && (-0x81 < src1w)) {
      psVar2 = emit_x86_instruction(compiler,1,local_50,0,inst._4_4_,src2w);
      if (psVar2 == (sljit_u8 *)0x0) {
        return compiler->error;
      }
      *psVar2 = 'k';
      puVar3 = (undefined1 *)ensure_buf(compiler,2);
      if (puVar3 == (undefined1 *)0x0) {
        return compiler->error;
      }
      *puVar3 = 1;
      compiler->size = compiler->size + 1;
      puVar3[1] = (char)src1w;
    }
    else if ((src1w < 0x80000000) && (-0x80000001 < src1w)) {
      psVar2 = emit_x86_instruction(compiler,1,local_50,0,inst._4_4_,src2w);
      if (psVar2 == (sljit_u8 *)0x0) {
        return compiler->error;
      }
      *psVar2 = 'i';
      puVar3 = (undefined1 *)ensure_buf(compiler,5);
      if (puVar3 == (undefined1 *)0x0) {
        return compiler->error;
      }
      *puVar3 = 4;
      compiler->size = compiler->size + 4;
      sljit_unaligned_store_s32(puVar3 + 1,(sljit_s32)src1w);
    }
    else {
      if ((local_50 != inst._4_4_) &&
         (sVar1 = emit_mov(compiler,local_50,0,inst._4_4_,src2w), sVar1 != 0)) {
        return compiler->error;
      }
      sVar1 = emit_load_imm64(compiler,0x10,src1w);
      if (sVar1 != 0) {
        return compiler->error;
      }
      psVar2 = emit_x86_instruction(compiler,2,local_50,0,0x10,0);
      if (psVar2 == (sljit_u8 *)0x0) {
        return compiler->error;
      }
      *psVar2 = '\x0f';
      psVar2[1] = 0xaf;
    }
  }
  if (((dst & 0x80U) == 0) || (sVar1 = emit_mov(compiler,dst,dstw,0xf,0), sVar1 == 0)) {
    compiler_local._4_4_ = 0;
  }
  else {
    compiler_local._4_4_ = compiler->error;
  }
  return compiler_local._4_4_;
}

Assistant:

static sljit_s32 emit_mul(struct sljit_compiler *compiler,
	sljit_s32 dst, sljit_sw dstw,
	sljit_s32 src1, sljit_sw src1w,
	sljit_s32 src2, sljit_sw src2w)
{
	sljit_u8* inst;
	sljit_s32 dst_r;

	dst_r = SLOW_IS_REG(dst) ? dst : TMP_REG1;

	/* Register destination. */
	if (dst_r == src1 && !(src2 & SLJIT_IMM)) {
		inst = emit_x86_instruction(compiler, 2, dst_r, 0, src2, src2w);
		FAIL_IF(!inst);
		*inst++ = GROUP_0F;
		*inst = IMUL_r_rm;
	}
	else if (dst_r == src2 && !(src1 & SLJIT_IMM)) {
		inst = emit_x86_instruction(compiler, 2, dst_r, 0, src1, src1w);
		FAIL_IF(!inst);
		*inst++ = GROUP_0F;
		*inst = IMUL_r_rm;
	}
	else if (src1 & SLJIT_IMM) {
		if (src2 & SLJIT_IMM) {
			EMIT_MOV(compiler, dst_r, 0, SLJIT_IMM, src2w);
			src2 = dst_r;
			src2w = 0;
		}

		if (src1w <= 127 && src1w >= -128) {
			inst = emit_x86_instruction(compiler, 1, dst_r, 0, src2, src2w);
			FAIL_IF(!inst);
			*inst = IMUL_r_rm_i8;
			inst = (sljit_u8*)ensure_buf(compiler, 1 + 1);
			FAIL_IF(!inst);
			INC_SIZE(1);
			*inst = (sljit_s8)src1w;
		}
#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
		else {
			inst = emit_x86_instruction(compiler, 1, dst_r, 0, src2, src2w);
			FAIL_IF(!inst);
			*inst = IMUL_r_rm_i32;
			inst = (sljit_u8*)ensure_buf(compiler, 1 + 4);
			FAIL_IF(!inst);
			INC_SIZE(4);
			sljit_unaligned_store_sw(inst, src1w);
		}
#else
		else if (IS_HALFWORD(src1w)) {
			inst = emit_x86_instruction(compiler, 1, dst_r, 0, src2, src2w);
			FAIL_IF(!inst);
			*inst = IMUL_r_rm_i32;
			inst = (sljit_u8*)ensure_buf(compiler, 1 + 4);
			FAIL_IF(!inst);
			INC_SIZE(4);
			sljit_unaligned_store_s32(inst, (sljit_s32)src1w);
		}
		else {
			if (dst_r != src2)
				EMIT_MOV(compiler, dst_r, 0, src2, src2w);
			FAIL_IF(emit_load_imm64(compiler, TMP_REG2, src1w));
			inst = emit_x86_instruction(compiler, 2, dst_r, 0, TMP_REG2, 0);
			FAIL_IF(!inst);
			*inst++ = GROUP_0F;
			*inst = IMUL_r_rm;
		}
#endif
	}
	else if (src2 & SLJIT_IMM) {
		/* Note: src1 is NOT immediate. */

		if (src2w <= 127 && src2w >= -128) {
			inst = emit_x86_instruction(compiler, 1, dst_r, 0, src1, src1w);
			FAIL_IF(!inst);
			*inst = IMUL_r_rm_i8;
			inst = (sljit_u8*)ensure_buf(compiler, 1 + 1);
			FAIL_IF(!inst);
			INC_SIZE(1);
			*inst = (sljit_s8)src2w;
		}
#if (defined SLJIT_CONFIG_X86_32 && SLJIT_CONFIG_X86_32)
		else {
			inst = emit_x86_instruction(compiler, 1, dst_r, 0, src1, src1w);
			FAIL_IF(!inst);
			*inst = IMUL_r_rm_i32;
			inst = (sljit_u8*)ensure_buf(compiler, 1 + 4);
			FAIL_IF(!inst);
			INC_SIZE(4);
			sljit_unaligned_store_sw(inst, src2w);
		}
#else
		else if (IS_HALFWORD(src2w)) {
			inst = emit_x86_instruction(compiler, 1, dst_r, 0, src1, src1w);
			FAIL_IF(!inst);
			*inst = IMUL_r_rm_i32;
			inst = (sljit_u8*)ensure_buf(compiler, 1 + 4);
			FAIL_IF(!inst);
			INC_SIZE(4);
			sljit_unaligned_store_s32(inst, (sljit_s32)src2w);
		}
		else {
			if (dst_r != src1)
				EMIT_MOV(compiler, dst_r, 0, src1, src1w);
			FAIL_IF(emit_load_imm64(compiler, TMP_REG2, src2w));
			inst = emit_x86_instruction(compiler, 2, dst_r, 0, TMP_REG2, 0);
			FAIL_IF(!inst);
			*inst++ = GROUP_0F;
			*inst = IMUL_r_rm;
		}
#endif
	}
	else {
		/* Neither argument is immediate. */
		if (ADDRESSING_DEPENDS_ON(src2, dst_r))
			dst_r = TMP_REG1;
		EMIT_MOV(compiler, dst_r, 0, src1, src1w);
		inst = emit_x86_instruction(compiler, 2, dst_r, 0, src2, src2w);
		FAIL_IF(!inst);
		*inst++ = GROUP_0F;
		*inst = IMUL_r_rm;
	}

	if (dst & SLJIT_MEM)
		EMIT_MOV(compiler, dst, dstw, TMP_REG1, 0);

	return SLJIT_SUCCESS;
}